

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O0

int Io_ReadBlifNetworkDefaultInputDrive(Io_ReadBlif_t *p,Vec_Ptr_t *vTokens)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double TimeFall;
  double TimeRise;
  char *pFoo2;
  char *pFoo1;
  Vec_Ptr_t *vTokens_local;
  Io_ReadBlif_t *p_local;
  
  pFoo1 = (char *)vTokens;
  vTokens_local = (Vec_Ptr_t *)p;
  iVar1 = strncmp((char *)*vTokens->pArray,".default_input_drive",0x15);
  if (iVar1 == 0) {
    if (*(int *)(pFoo1 + 4) == 3) {
      dVar2 = strtod(*(char **)(*(long *)(pFoo1 + 8) + 8),&pFoo2);
      dVar3 = strtod(*(char **)(*(long *)(pFoo1 + 8) + 0x10),(char **)&TimeRise);
      if ((*pFoo2 == '\0') && (*(char *)TimeRise == '\0')) {
        vTokens_local[7].nCap = (int)(float)dVar2;
        vTokens_local[7].nSize = (int)(float)dVar3;
        *(undefined4 *)&vTokens_local[8].pArray = 1;
        p_local._4_4_ = 0;
      }
      else {
        iVar1 = Extra_FileReaderGetLineNumber((Extra_FileReader_t *)vTokens_local->pArray,0);
        vTokens_local[2].nCap = iVar1;
        sprintf((char *)&vTokens_local[9].pArray,
                "Bad value (%s %s) for rise or fall time on .default_input_drive line.",
                *(undefined8 *)(*(long *)(pFoo1 + 8) + 8),
                *(undefined8 *)(*(long *)(pFoo1 + 8) + 0x10));
        Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)vTokens_local);
        p_local._4_4_ = 1;
      }
    }
    else {
      iVar1 = Extra_FileReaderGetLineNumber((Extra_FileReader_t *)vTokens_local->pArray,0);
      vTokens_local[2].nCap = iVar1;
      sprintf((char *)&vTokens_local[9].pArray,
              "Wrong number of arguments on .default_input_drive line.");
      Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)vTokens_local);
      p_local._4_4_ = 1;
    }
    return p_local._4_4_;
  }
  __assert_fail("strncmp( (char *)vTokens->pArray[0], \".default_input_drive\", 21 ) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                ,0x488,"int Io_ReadBlifNetworkDefaultInputDrive(Io_ReadBlif_t *, Vec_Ptr_t *)");
}

Assistant:

int Io_ReadBlifNetworkDefaultInputDrive( Io_ReadBlif_t * p, Vec_Ptr_t * vTokens )
{
    char * pFoo1, * pFoo2;
    double TimeRise, TimeFall;

    // make sure this is indeed the .inputs line
    assert( strncmp( (char *)vTokens->pArray[0], ".default_input_drive", 21 ) == 0 );
    if ( vTokens->nSize != 3 )
    {
        p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
        sprintf( p->sError, "Wrong number of arguments on .default_input_drive line." );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }
    TimeRise = strtod( (char *)vTokens->pArray[1], &pFoo1 );
    TimeFall = strtod( (char *)vTokens->pArray[2], &pFoo2 );
    if ( *pFoo1 != '\0' || *pFoo2 != '\0' )
    {
        p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
        sprintf( p->sError, "Bad value (%s %s) for rise or fall time on .default_input_drive line.", (char*)vTokens->pArray[1], (char*)vTokens->pArray[2] );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }
    // set timing info
//    Abc_NtkTimeSetDefaultInputDrive( p->pNtkCur, (float)TimeRise, (float)TimeFall );
    p->DefInDriRise = (float)TimeRise;
    p->DefInDriFall = (float)TimeFall;
    p->fHaveDefInDri = 1;
    return 0;
}